

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_util.c
# Opt level: O2

void do_vararg_push(dill_stream_conflict s,char *arg_str,__va_list_tag *ap)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  arg_info_list __ptr;
  ulong uVar4;
  char *pcVar5;
  jmp_table pjVar6;
  ulong uVar7;
  uint *puVar8;
  double *pdVar9;
  type_union *ptVar10;
  int iVar11;
  int iVar12;
  double dVar13;
  int iStack_850;
  int arg_count;
  type_union value [256];
  
  __ptr = translate_arg_str(arg_str,&arg_count);
  (*s->j->push)(s,0xb,-1);
  iVar1 = s->j->do_reverse_push;
  if (iVar1 != 0) {
    s->p->doing_reverse_push = 1;
  }
  uVar4 = 0;
  uVar7 = 0;
  if (0 < arg_count) {
    uVar7 = (ulong)(uint)arg_count;
  }
  pcVar5 = &__ptr->is_immediate;
  for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
    if (*pcVar5 == '\0') {
switchD_00107e38_caseD_0:
      uVar2 = ap->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar8 = (uint *)((ulong)uVar2 + (long)ap->reg_save_area);
        ap->gp_offset = uVar2 + 8;
      }
      else {
        puVar8 = (uint *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar8 + 2;
      }
      value[uVar4].u = *puVar8;
    }
    else {
      switch(((arg_info *)(pcVar5 + -2))->type) {
      case '\0':
      case '\x01':
      case '\x02':
      case '\x03':
      case '\x04':
      case '\x05':
        goto switchD_00107e38_caseD_0;
      case '\x06':
      case '\a':
      case '\b':
        uVar2 = ap->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          ptVar10 = (type_union *)((ulong)uVar2 + (long)ap->reg_save_area);
          ap->gp_offset = uVar2 + 8;
        }
        else {
          ptVar10 = (type_union *)ap->overflow_arg_area;
          ap->overflow_arg_area = ptVar10 + 1;
        }
        value[uVar4] = *ptVar10;
        break;
      case '\t':
        uVar2 = ap->fp_offset;
        if ((ulong)uVar2 < 0xa1) {
          pdVar9 = (double *)((ulong)uVar2 + (long)ap->reg_save_area);
          ap->fp_offset = uVar2 + 0x10;
        }
        else {
          pdVar9 = (double *)ap->overflow_arg_area;
          ap->overflow_arg_area = pdVar9 + 1;
        }
        value[uVar4].f = (float)*pdVar9;
        break;
      case '\n':
        uVar2 = ap->fp_offset;
        if ((ulong)uVar2 < 0xa1) {
          ptVar10 = (type_union *)((ulong)uVar2 + (long)ap->reg_save_area);
          ap->fp_offset = uVar2 + 0x10;
        }
        else {
          ptVar10 = (type_union *)ap->overflow_arg_area;
          ap->overflow_arg_area = ptVar10 + 1;
        }
        value[uVar4] = *ptVar10;
        break;
      default:
        goto switchD_00107e38_default;
      }
    }
    pcVar5 = pcVar5 + 0x14;
  }
  iVar12 = 0;
  iVar11 = arg_count;
  do {
    iVar11 = iVar11 + -1;
    if ((int)uVar7 == iVar12) {
      free(__ptr);
      return;
    }
    iVar3 = iVar11;
    if (iVar1 == 0) {
      iVar3 = iVar12;
    }
    if (__ptr[iVar3].is_immediate == '\0') {
      (*s->j->push)(s,(int)__ptr[iVar3].type,value[iVar3].u);
      goto LAB_00107fbc;
    }
    switch(__ptr[iVar3].type) {
    case '\0':
    case '\x02':
    case '\x04':
      pjVar6 = s->j;
      uVar4 = (ulong)value[iVar3].i;
      iStack_850 = 4;
      break;
    case '\x01':
    case '\x03':
    case '\x05':
      pjVar6 = s->j;
      uVar4 = (ulong)value[iVar3].u;
      iStack_850 = 5;
      break;
    case '\x06':
      pjVar6 = s->j;
      uVar4 = value[iVar3].l;
      iStack_850 = 6;
      break;
    case '\a':
      pjVar6 = s->j;
      uVar4 = value[iVar3].l;
      iStack_850 = 7;
      break;
    case '\b':
      (*s->j->pushpi)(s,8,(void *)value[iVar3].l);
      goto LAB_00107fbc;
    case '\t':
      pjVar6 = s->j;
      dVar13 = (double)value[iVar3].f;
      iStack_850 = 9;
      goto LAB_00107fd5;
    case '\n':
      pjVar6 = s->j;
      dVar13 = (double)value[iVar3].l;
      iStack_850 = 10;
LAB_00107fd5:
      (*pjVar6->pushfi)(s,iStack_850,dVar13);
      goto LAB_00107fbc;
    default:
switchD_00107e38_default:
      fwrite("do_push_args: unknown type\n",0x1b,1,_stderr);
      exit(1);
    }
    (*pjVar6->pushi)(s,iStack_850,uVar4);
LAB_00107fbc:
    iVar12 = iVar12 + 1;
  } while( true );
}

Assistant:

static void
do_vararg_push(dill_stream s, const char* arg_str, va_list ap)
{
    int i, arg_count;
    int reverse = 0;
    arg_info_list args = translate_arg_str(arg_str, &arg_count);
    type_union value[256];

    dill_push_init(s);

    reverse = dill_do_reverse_vararg_push(s);

    for (i = 0; i < arg_count; i++) {
        if (!args[i].is_immediate) {
            value[i].i = va_arg(ap, int);
        } else {
            switch (args[i].type) {
            case DILL_UC:
            case DILL_US:
            case DILL_U:
                value[i].u = va_arg(ap, unsigned);
                break;
            case DILL_C:
            case DILL_S:
            case DILL_I:
                value[i].i = va_arg(ap, int);
                break;
            case DILL_L:
                value[i].l = va_arg(ap, long);
                break;
            case DILL_UL:
                value[i].ul = va_arg(ap, unsigned long);
                break;
            case DILL_P:
                value[i].p = va_arg(ap, void*);
                break;
            case DILL_F:
                value[i].f = (float)va_arg(ap, double);
                break;
            case DILL_D:
                value[i].d = va_arg(ap, double);
                break;
            default:
                fprintf(stderr, "do_push_args: unknown type\n");
                exit(1);
            }
        }
    }

    /* push all arguments */
    for (i = 0; i < arg_count; i++) {
        int arg = i;
        if (reverse) {
            arg = arg_count - i - 1;
        }
        if (!args[arg].is_immediate) {
            dill_push_arg(s, args[arg].type, value[arg].i);
        } else {
            switch (args[arg].type) {
            case DILL_UC:
            case DILL_US:
            case DILL_U:
                dill_push_argui(s, value[arg].u);
                break;
            case DILL_C:
            case DILL_S:
            case DILL_I:
                dill_push_argii(s, value[arg].i);
                break;
            case DILL_L:
                dill_push_argli(s, value[arg].l);
                break;
            case DILL_UL:
                dill_push_arguli(s, value[arg].ul);
                break;
            case DILL_P:
                dill_push_argpi(s, value[arg].p);
                break;
            case DILL_F:
                dill_push_argfi(s, value[arg].f);
                break;
            case DILL_D:
                dill_push_argdi(s, value[arg].d);
                break;
            default:
                fprintf(stderr, "do_push_args: unknown type\n");
                exit(1);
            }
        }
    }
    free(args);
}